

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::DirectoryInputNodeTask::start
          (DirectoryInputNodeTask *this,TaskInterface ti)

{
  TaskInterface ti_00;
  bool bVar1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *this_00;
  reference pSVar2;
  StringRef path;
  BuildKey local_88;
  KeyType local_68;
  BuildKey *local_48;
  StringRef mustScanAfterPath;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2;
  DirectoryInputNodeTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryInputNodeTask *)ti.impl;
  this_00 = llbuild::buildsystem::BuildNode::getMustScanAfterPaths(this->node);
  __end2 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin(this_00);
  mustScanAfterPath.Length =
       (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                *)&mustScanAfterPath.Length);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
             ::operator*(&__end2);
    local_48 = (BuildKey *)pSVar2->Data;
    mustScanAfterPath.Data = (char *)pSVar2->Length;
    path.Length._0_4_ = this->totalBlockingDeps + 1;
    this->totalBlockingDeps = (int)path.Length;
    path.Data = mustScanAfterPath.Data;
    path.Length._4_4_ = 0;
    llbuild::buildsystem::BuildKey::makeNode(&local_88,local_48,path);
    llbuild::buildsystem::BuildKey::toData(&local_68,&local_88);
    llbuild::core::TaskInterface::request
              ((TaskInterface *)&this_local,&local_68,(long)this->totalBlockingDeps);
    llbuild::core::KeyType::~KeyType(&local_68);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_88);
    __gnu_cxx::
    __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
    ::operator++(&__end2);
  }
  if (this->totalBlockingDeps == 0) {
    ti_00.ctx = ti_local.impl;
    ti_00.impl = this_local;
    performUnblockedRequest(this,ti_00);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // We reserve inputID=0 for the blocked DirectoryTreeSignature request.
    // inputID=1, 2, ... are used for mustScanAfterPaths
    for (auto mustScanAfterPath: node.getMustScanAfterPaths()) {
      ++totalBlockingDeps;
      ti.request(BuildKey::makeNode(mustScanAfterPath).toData(), totalBlockingDeps);
    }

    // If mustScanAfterPaths is empty, simply request DirectoryTreeSignature in start
    if (totalBlockingDeps == 0) {
      performUnblockedRequest(ti);
    }
  }